

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c0_compile_gramma.hpp
# Opt level: O0

void __thiscall SwitchChildStatement::LogOutput(SwitchChildStatement *this)

{
  allocator local_31;
  undefined1 local_30 [8];
  string str;
  SwitchChildStatement *this_local;
  
  str.field_2._8_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_30,"This is a switch child statement",&local_31);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  LogTools::GrammaNormalLogs(g_log_tools,(string *)local_30);
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

void LogOutput() {
        string str("This is a switch child statement");
        g_log_tools->GrammaNormalLogs(str);
    }